

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

bool __thiscall units::fixed_measurement::operator==(fixed_measurement *this,fixed_measurement *val)

{
  bool bVar1;
  double local_38;
  unit local_20;
  fixed_measurement *local_18;
  fixed_measurement *val_local;
  fixed_measurement *this_local;
  
  local_18 = val;
  val_local = this;
  local_20 = units(val);
  bVar1 = unit::operator==(&this->units_,&local_20);
  if (bVar1) {
    local_38 = value(local_18);
  }
  else {
    local_38 = value_as(local_18,&this->units_);
  }
  bVar1 = operator==(this,local_38);
  return bVar1;
}

Assistant:

bool operator==(const fixed_measurement& val) const
    {
        return operator==(
            (units_ == val.units()) ? val.value() : val.value_as(units_));
    }